

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTableGrow(Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,Name table)

{
  Name table_00;
  TableGrow *pTVar1;
  bool bVar2;
  Ok local_d1;
  IRBuilder *local_d0;
  size_t local_c8;
  uint local_bc;
  Err local_b8;
  Err *local_88;
  Err *err;
  Result<wasm::Ok> _val;
  TableGrow curr;
  IRBuilder *this_local;
  Name table_local;
  
  table_local.super_IString.str._M_len = table.super_IString.str._M_str;
  this_local = table.super_IString.str._M_len;
  pTVar1 = (TableGrow *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  curr.delta = (Expression *)this;
  table_local.super_IString.str._M_str = (char *)__return_storage_ptr__;
  TableGrow::TableGrow(pTVar1);
  wasm::Name::operator=
            ((Name *)&curr.super_SpecificExpression<(wasm::Expression::Id)48>.super_Expression.type,
             (Name *)&this_local);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitTableGrow
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pTVar1);
  local_88 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_88 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_b8,local_88);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_b8);
    wasm::Err::~Err(&local_b8);
  }
  local_bc = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_bc == 0) {
    local_d0 = this_local;
    local_c8 = table_local.super_IString.str._M_len;
    table_00.super_IString.str._M_str = (char *)table_local.super_IString.str._M_len;
    table_00.super_IString.str._M_len = (size_t)this_local;
    pTVar1 = Builder::makeTableGrow
                       (&this->builder,table_00,(Expression *)curr.table.super_IString.str._M_str,
                        curr.value);
    push(this,(Expression *)pTVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_d1);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTableGrow(Name table) {
  TableGrow curr;
  curr.table = table;
  CHECK_ERR(visitTableGrow(&curr));
  push(builder.makeTableGrow(table, curr.value, curr.delta));
  return Ok{};
}